

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O3

void nni_posix_udp_cb(void *arg,uint events)

{
  nni_list *pnVar1;
  undefined8 uVar2;
  nni_iov *pnVar3;
  nng_err nVar4;
  int iVar5;
  int iVar6;
  nni_aio *pnVar7;
  ulong uVar8;
  ssize_t sVar9;
  nni_sockaddr *pnVar10;
  size_t sVar11;
  int *piVar12;
  uint events_00;
  long lVar13;
  undefined1 local_188 [8];
  sockaddr_storage ss;
  iovec iov [8];
  msghdr local_78;
  nni_iov *local_40;
  nng_iov *aiov;
  uint niov;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x70));
  aiov._0_4_ = events;
  if ((events & 1) != 0) {
    pnVar1 = (nni_list *)((long)arg + 0x40);
    pnVar7 = (nni_aio *)nni_list_first(pnVar1);
    while (pnVar7 != (nni_aio *)0x0) {
      nni_aio_get_iov(pnVar7,(uint *)((long)&aiov + 4),&local_40);
      if (8 < aiov._4_4_) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                  ,0x90,"niov <= NNI_AIO_MAX_IOV");
      }
      pnVar3 = local_40;
      local_78.msg_control = (void *)0x0;
      local_78.msg_controllen = 0;
      local_78.msg_namelen = 0;
      local_78._12_4_ = 0;
      uVar2 = local_78._8_8_;
      local_78._12_4_ = 0;
      local_78.msg_flags = 0;
      local_78._52_4_ = 0;
      if (aiov._4_4_ == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (ulong)aiov._4_4_;
        lVar13 = 0;
        local_78._8_8_ = uVar2;
        do {
          *(undefined8 *)(ss.__ss_padding + lVar13 + 0x76) =
               *(undefined8 *)((long)&pnVar3->iov_buf + lVar13);
          *(undefined8 *)((long)&iov[0].iov_base + lVar13) =
               *(undefined8 *)((long)&pnVar3->iov_len + lVar13);
          lVar13 = lVar13 + 0x10;
        } while (uVar8 << 4 != lVar13);
      }
      local_78.msg_iov = (iovec *)&ss.__ss_align;
      local_78.msg_name = local_188;
      local_78.msg_namelen = 0x80;
      local_78.msg_iovlen = uVar8;
      sVar9 = recvmsg(*(int *)((long)arg + 0x38),&local_78,0);
      if ((int)sVar9 < 0) {
        piVar12 = __errno_location();
        if (*piVar12 == 0xb) break;
        nVar4 = nni_plat_errno(*piVar12);
      }
      else {
        nVar4 = NNG_OK;
        pnVar10 = (nni_sockaddr *)nni_aio_get_input(pnVar7,0);
        if (pnVar10 != (nni_sockaddr *)0x0) {
          nni_posix_sockaddr2nn(pnVar10,local_188,local_78._8_8_ & 0xffffffff);
        }
      }
      nni_list_remove(pnVar1,pnVar7);
      nni_aio_finish(pnVar7,nVar4,(long)(int)sVar9);
      pnVar7 = (nni_aio *)nni_list_first(pnVar1);
    }
  }
  if (((uint)aiov & 4) != 0) {
    pnVar1 = (nni_list *)((long)arg + 0x58);
    pnVar7 = (nni_aio *)nni_list_first(pnVar1);
    while (pnVar7 != (nni_aio *)0x0) {
      nni_aio_get_iov(pnVar7,(uint *)((long)&aiov + 4),&local_40);
      if (8 < aiov._4_4_) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/posix/posix_udp.c"
                  ,0xdd,"niov <= NNI_AIO_MAX_IOV");
      }
      pnVar10 = (nni_sockaddr *)nni_aio_get_input(pnVar7,0);
      sVar11 = nni_posix_nn2sockaddr(local_188,pnVar10);
      pnVar3 = local_40;
      if ((int)sVar11 < 1) {
        nVar4 = NNG_EADDRINVAL;
        sVar11 = 0;
      }
      else {
        local_78.msg_control = (void *)0x0;
        local_78.msg_controllen = 0;
        local_78.msg_namelen = 0;
        local_78._12_4_ = 0;
        uVar2 = local_78._8_8_;
        local_78._12_4_ = 0;
        local_78.msg_flags = 0;
        local_78._52_4_ = 0;
        uVar8 = (ulong)aiov._4_4_;
        if (uVar8 == 0) {
          uVar8 = 0;
        }
        else {
          lVar13 = 0;
          local_78._8_8_ = uVar2;
          do {
            *(undefined8 *)(ss.__ss_padding + lVar13 + 0x76) =
                 *(undefined8 *)((long)&pnVar3->iov_buf + lVar13);
            *(undefined8 *)((long)&iov[0].iov_base + lVar13) =
                 *(undefined8 *)((long)&pnVar3->iov_len + lVar13);
            lVar13 = lVar13 + 0x10;
          } while (uVar8 << 4 != lVar13);
        }
        local_78.msg_iov = (iovec *)&ss.__ss_align;
        local_78.msg_name = local_188;
        local_78.msg_namelen = (int)sVar11;
        local_78.msg_iovlen = uVar8;
        sVar9 = sendmsg(*(int *)((long)arg + 0x38),&local_78,0x4000);
        nVar4 = NNG_OK;
        if ((int)sVar9 < 0) {
          piVar12 = __errno_location();
          if (*piVar12 == 0xb) break;
          nVar4 = nni_plat_errno(*piVar12);
        }
        sVar11 = (size_t)(int)sVar9;
      }
      nni_list_remove(pnVar1,pnVar7);
      nni_aio_finish(pnVar7,nVar4,sVar11);
      pnVar7 = (nni_aio *)nni_list_first(pnVar1);
    }
  }
  iVar5 = 7;
  if (((uint)aiov & 0x38) == 0) {
    iVar5 = nni_list_empty((nni_list *)((long)arg + 0x58));
    iVar6 = nni_list_empty((nni_list *)((long)arg + 0x40));
    events_00 = (uint)(iVar6 == 0) | (uint)(iVar5 == 0) << 2;
    if ((events_00 == 0) || (iVar5 = nni_posix_pfd_arm((nni_posix_pfd *)arg,events_00), iVar5 == 0))
    goto LAB_00124d3a;
  }
  nni_posix_udp_doerror((nni_plat_udp *)arg,iVar5);
LAB_00124d3a:
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x70));
  return;
}

Assistant:

static void
nni_posix_udp_cb(void *arg, unsigned events)
{
	nni_plat_udp *udp = arg;

	nni_mtx_lock(&udp->udp_mtx);
	if (events & NNI_POLL_IN) {
		nni_posix_udp_dorecv(udp);
	}
	if (events & NNI_POLL_OUT) {
		nni_posix_udp_dosend(udp);
	}
	if (events & (NNI_POLL_HUP | NNI_POLL_ERR | NNI_POLL_INVAL)) {
		nni_posix_udp_doclose(udp);
	} else {
		events = 0;
		if (!nni_list_empty(&udp->udp_sendq)) {
			events |= NNI_POLL_OUT;
		}
		if (!nni_list_empty(&udp->udp_recvq)) {
			events |= NNI_POLL_IN;
		}
		if (events) {
			int rv;
			rv = nni_posix_pfd_arm(&udp->udp_pfd, events);
			if (rv != 0) {
				nni_posix_udp_doerror(udp, rv);
			}
		}
	}
	nni_mtx_unlock(&udp->udp_mtx);
}